

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O0

int JS_ThrowTypeErrorReadOnly(JSContext *ctx,int flags,JSAtom atom)

{
  BOOL BVar1;
  uint in_EDX;
  uint in_ESI;
  JSContext *in_RDI;
  int local_4;
  
  if ((in_ESI & 0x4000) == 0) {
    if ((in_ESI & 0x8000) != 0) {
      BVar1 = is_strict_mode(in_RDI);
      if (BVar1 != 0) goto LAB_0012f51c;
    }
    local_4 = 0;
  }
  else {
LAB_0012f51c:
    __JS_ThrowTypeErrorAtom(in_RDI,(JSAtom)(ulong)in_EDX,"\'%s\' is read-only","");
    local_4 = -1;
  }
  return local_4;
}

Assistant:

static int JS_ThrowTypeErrorReadOnly(JSContext *ctx, int flags, JSAtom atom)
{
    if ((flags & JS_PROP_THROW) ||
        ((flags & JS_PROP_THROW_STRICT) && is_strict_mode(ctx))) {
        JS_ThrowTypeErrorAtom(ctx, "'%s' is read-only", atom);
        return -1;
    } else {
        return FALSE;
    }
}